

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.cc
# Opt level: O2

void tcmalloc::ThreadCache::RecomputePerThreadCacheSize(void)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long *plVar6;
  int iVar7;
  double dVar8;
  
  uVar2 = overall_thread_cache_size_;
  uVar5 = 1;
  if (1 < (int)thread_heap_count_) {
    uVar5 = (ulong)thread_heap_count_;
  }
  lVar4 = 0;
  uVar3 = min_per_thread_cache_size_;
  if (min_per_thread_cache_size_ < overall_thread_cache_size_ / uVar5) {
    uVar3 = overall_thread_cache_size_ / uVar5;
  }
  if (0x3fffff < uVar3) {
    uVar3 = 0x400000;
  }
  dVar8 = ((double)CONCAT44(0x45300000,(int)(per_thread_cache_size_ >> 0x20)) -
          1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)per_thread_cache_size_) - 4503599627370496.0);
  if (dVar8 <= 1.0) {
    dVar8 = 1.0;
  }
  plVar6 = &thread_heaps_;
  while (lVar1 = *plVar6, lVar1 != 0) {
    iVar7 = *(int *)(lVar1 + 0x1004);
    if ((double)(long)uVar3 / dVar8 < 1.0) {
      iVar7 = (int)((double)iVar7 * ((double)(long)uVar3 / dVar8));
      *(int *)(lVar1 + 0x1004) = iVar7;
    }
    lVar4 = lVar4 + iVar7;
    plVar6 = (long *)(lVar1 + 0x1020);
  }
  unclaimed_cache_space_ = uVar2 - lVar4;
  per_thread_cache_size_ = uVar3;
  return;
}

Assistant:

void ThreadCache::RecomputePerThreadCacheSize() {
  // Divide available space across threads
  int n = thread_heap_count_ > 0 ? thread_heap_count_ : 1;
  size_t space = overall_thread_cache_size_ / n;

  size_t min_size = min_per_thread_cache_size_.load(std::memory_order_relaxed);
  // Limit to allowed range
  if (space < min_size) space = min_size;
  if (space > kMaxThreadCacheSize) space = kMaxThreadCacheSize;

  double ratio = space / std::max<double>(1, per_thread_cache_size_);
  size_t claimed = 0;
  for (ThreadCache* h = thread_heaps_; h != nullptr; h = h->next_) {
    // Increasing the total cache size should not circumvent the
    // slow-start growth of max_size_.
    if (ratio < 1.0) {
      h->SetMaxSize(h->max_size_ * ratio);
    }
    claimed += h->max_size_;
  }
  unclaimed_cache_space_ = overall_thread_cache_size_ - claimed;
  per_thread_cache_size_ = space;
}